

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

int __thiscall
Connection::receive(Connection *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer pfVar1;
  int iVar2;
  int i;
  int iVar3;
  pointer pfVar4;
  
  iVar2 = 0;
  if (this->socket_status == true) {
    iVar2 = this->data_size;
    pfVar1 = (this->buffer_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->buffer_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      if (pfVar4 != pfVar1) {
        (this->buffer_data).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar1;
      }
      pfVar4 = pfVar1;
    }
    this->socket_open = false;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Connection::receive(std::vector<unsigned char> &data)
{
    //Function to receive data from the robot
    int success=0;
    if(open())
    {
        for(int i=0;i<data_size;i++)
        {
            buffer_data.clear();

            //buffer_data.push_back((float)data[i]);
        }

        success= close();

    }
    return success;
}